

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall
slang::CommandLine::parseStr
          (CommandLine *this,string_view argList,ParseOptions options,bool *hasArg,string *current,
          SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *storage)

{
  byte *pbVar1;
  char **ppcVar2;
  byte bVar3;
  char **ppcVar4;
  char **ptr;
  string_view argList_00;
  string result;
  char **local_68;
  string local_60;
  ParseOptions local_3c;
  CommandLine *local_38;
  
  local_68 = (char **)argList._M_str;
  if (argList._M_len != 0) {
    ptr = (char **)(argList._M_len + (long)local_68);
    local_3c = (ParseOptions)((uint)options & 0xff00ffff);
    local_38 = this;
    do {
      ppcVar4 = (char **)((long)local_68 + 1);
      bVar3 = *(byte *)local_68;
      if ((bVar3 - 9 < 5) || (bVar3 == 0x20)) {
        if (*hasArg == true) {
          local_68 = ppcVar4;
          SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
                    ((SmallVectorBase<std::__cxx11::string> *)storage,current);
          current->_M_string_length = 0;
          *(current->_M_dataplus)._M_p = '\0';
          *hasArg = false;
          ppcVar4 = local_68;
        }
      }
      else if (((uint)options & 1) == 0) {
        if (bVar3 == 0x5c) {
LAB_001cad45:
          if (((ppcVar4 != ptr) && (*(byte *)ppcVar4 != 10)) && (*(byte *)ppcVar4 != 0xd)) {
            pbVar1 = (byte *)((long)local_68 + 1);
            local_68 = (char **)((long)local_68 + 2);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(current,*pbVar1);
            *hasArg = true;
            ppcVar4 = local_68;
          }
        }
        else {
LAB_001cacc0:
          if (bVar3 == 0x24) {
            if ((ppcVar4 != ptr & options.expandEnvVars) != 1) goto LAB_001caeb5;
            local_68 = ppcVar4;
            OS::parseEnvVar_abi_cxx11_(&local_60,(OS *)&local_68,ptr,(char *)(ulong)bVar3);
            argList_00._M_str = local_60._M_dataplus._M_p;
            argList_00._M_len = local_60._M_string_length;
            parseStr(local_38,argList_00,local_3c,hasArg,current,storage);
            ppcVar4 = local_68;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
              ppcVar4 = local_68;
            }
          }
          else {
LAB_001cad81:
            *hasArg = true;
            local_68 = ppcVar4;
            if (bVar3 == 0x27) {
              while (ppcVar4 = local_68, local_68 != ptr) {
                bVar3 = *(byte *)local_68;
                ppcVar4 = (char **)((long)local_68 + 1);
                if (bVar3 == 0x27) break;
                local_68 = (char **)((long)local_68 + 1);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(current,bVar3);
              }
            }
            else {
              if (bVar3 != 0x22) goto LAB_001caeb9;
LAB_001cad97:
              ppcVar4 = local_68;
              if (local_68 != ptr) {
                ppcVar4 = (char **)((long)local_68 + 1);
                bVar3 = *(byte *)local_68;
                if (bVar3 == 0x5c) {
                  bVar3 = 0x5c;
                  if ((ppcVar4 != ptr) && ((*(byte *)ppcVar4 == 0x5c || (*(byte *)ppcVar4 == 0x22)))
                     ) {
                    ppcVar4 = (char **)((long)local_68 + 2);
                    bVar3 = *(byte *)((long)local_68 + 1);
                    goto LAB_001caddb;
                  }
                }
                else {
                  if (bVar3 == 0x22) goto LAB_001cac4c;
LAB_001caddb:
                  if (((bVar3 == 0x24) && (bVar3 = 0x24, ((uint)options >> 0x10 & 1) != 0)) &&
                     (ppcVar4 != ptr)) {
                    local_68 = ppcVar4;
                    OS::parseEnvVar_abi_cxx11_(&local_60,(OS *)&local_68,ptr,(char *)0x24);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(current,local_60._M_dataplus._M_p,local_60._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_60._M_dataplus._M_p != &local_60.field_2) {
                      operator_delete(local_60._M_dataplus._M_p,
                                      local_60.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_001cad97;
                  }
                }
                local_68 = ppcVar4;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back(current,bVar3);
                goto LAB_001cad97;
              }
            }
          }
        }
      }
      else if (bVar3 < 0x2f) {
        if (bVar3 != 0x23) goto LAB_001cacc0;
        local_68 = ppcVar4;
        if (*hasArg == true) {
          SmallVectorBase<std::__cxx11::string>::emplace_back<std::__cxx11::string>
                    ((SmallVectorBase<std::__cxx11::string> *)storage,current);
          current->_M_string_length = 0;
          *(current->_M_dataplus)._M_p = '\0';
          *hasArg = false;
        }
        for (; ((ppcVar4 = local_68, local_68 != ptr && (*(byte *)local_68 != 10)) &&
               (*(byte *)local_68 != 0xd)); local_68 = (char **)((long)local_68 + 1)) {
        }
      }
      else {
        if (bVar3 != 0x2f) {
          if (bVar3 == 0x5c) goto LAB_001cad45;
          goto LAB_001cad81;
        }
        if (ppcVar4 == ptr || *hasArg != false) {
LAB_001caeb5:
          *hasArg = true;
LAB_001caeb9:
          local_68 = ppcVar4;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (current,bVar3);
          ppcVar4 = local_68;
        }
        else if (*(byte *)ppcVar4 == 0x2a) {
          ppcVar2 = (char **)((long)local_68 + 2);
          do {
            ppcVar4 = ppcVar2;
            if (ppcVar4 == ptr) goto LAB_001cac4c;
            ppcVar2 = (char **)((long)ppcVar4 + 1);
          } while ((ppcVar2 == ptr || *(byte *)ppcVar4 != 0x2a) || (*(byte *)ppcVar2 != 0x2f));
          ppcVar4 = (char **)((long)ppcVar4 + 2);
        }
        else {
          if (*(byte *)ppcVar4 != 0x2f) goto LAB_001caeb5;
          ppcVar2 = (char **)((long)local_68 + 2);
          do {
            ppcVar4 = ppcVar2;
            if ((ppcVar4 == ptr) || (*(byte *)ppcVar4 == 10)) break;
            ppcVar2 = (char **)((long)ppcVar4 + 1);
          } while (*(byte *)ppcVar4 != 0xd);
        }
      }
LAB_001cac4c:
      local_68 = ppcVar4;
    } while (local_68 != ptr);
  }
  return;
}

Assistant:

void CommandLine::parseStr(std::string_view argList, ParseOptions options, bool& hasArg,
                           std::string& current, SmallVectorBase<std::string>& storage) {
    auto pushArg = [&]() {
        if (hasArg) {
            storage.emplace_back(std::move(current));
            current.clear();
            hasArg = false;
        }
    };

    auto ptr = argList.data();
    auto end = ptr + argList.size();
    while (ptr != end) {
        // Whitespace breaks up arguments.
        char c = *ptr++;
        if (isWhitespace(c)) {
            pushArg();
            continue;
        }

        // Check for and consume comments.
        if (options.supportComments && (c == '#' || c == '/')) {
            // Slash character only applies if we aren't building an argument already.
            // The hash always applies, even if adjacent to an argument.
            if (c == '#') {
                pushArg();
                while (ptr != end && !isNewline(*ptr))
                    ptr++;
                continue;
            }

            if (!hasArg && ptr != end) {
                if (*ptr == '/') {
                    pushArg();
                    ptr++;
                    while (ptr != end && !isNewline(*ptr))
                        ptr++;
                    continue;
                }
                else if (*ptr == '*') {
                    pushArg();
                    ptr++;
                    while (ptr != end) {
                        c = *ptr++;
                        if (c == '*' && ptr != end && *ptr == '/') {
                            ptr++;
                            break;
                        }
                    }
                    continue;
                }
            }
        }

        // Look for environment variables to expand.
        if (c == '$' && options.expandEnvVars && ptr != end) {
            std::string result = OS::parseEnvVar(ptr, end);

            ParseOptions newOptions = options;
            newOptions.expandEnvVars = false;
            parseStr(result, newOptions, hasArg, current, storage);
            continue;
        }

        // Escape character preserves the value of the next character.
        if (c == '\\') {
            if (ptr != end && *ptr != '\n' && *ptr != '\r') {
                current += *ptr++;
                hasArg = true;
            }
            continue;
        }

        // Any non-whitespace character here means we are building an argument.
        hasArg = true;

        // Single quotes consume all characters until the next single quote.
        if (c == '\'') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '\'')
                    break;
                current += c;
            }
            continue;
        }

        // Double quotes consume all characters except escaped characters.
        if (c == '"') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '"')
                    break;

                // Only backslashes and quotes can be escaped.
                if (c == '\\' && ptr != end && (*ptr == '\\' || *ptr == '"'))
                    c = *ptr++;

                if (c == '$' && options.expandEnvVars && ptr != end)
                    current.append(OS::parseEnvVar(ptr, end));
                else
                    current += c;
            }
            continue;
        }

        // Otherwise we just have a normal character.
        current += c;
    }
}